

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_context_create_compiler
          (spvc_context context,spvc_backend backend,spvc_parsed_ir parsed_ir,spvc_capture_mode mode
          ,spvc_compiler *compiler)

{
  bool bVar1;
  spvc_compiler_s *this;
  pointer psVar2;
  Compiler *pCVar3;
  CompilerGLSL *pCVar4;
  CompilerHLSL *pCVar5;
  CompilerMSL *pCVar6;
  CompilerCPP *pCVar7;
  CompilerReflection *pCVar8;
  pointer local_110;
  exception *e;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  int local_80;
  allocator local_69;
  string local_68;
  undefined1 local_41;
  unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_> local_40;
  unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_> comp;
  spvc_compiler *compiler_local;
  spvc_capture_mode mode_local;
  spvc_parsed_ir parsed_ir_local;
  spvc_backend backend_local;
  spvc_context context_local;
  
  comp._M_t.super___uniq_ptr_impl<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>._M_t.
  super__Tuple_impl<0UL,_spvc_compiler_s_*,_std::default_delete<spvc_compiler_s>_>.
  super__Head_base<0UL,_spvc_compiler_s_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvc_compiler_s,_std::default_delete<spvc_compiler_s>,_true,_true>)
       (__uniq_ptr_data<spvc_compiler_s,_std::default_delete<spvc_compiler_s>,_true,_true>)compiler;
  this = (spvc_compiler_s *)operator_new(0x20,(nothrow_t *)&std::nothrow);
  local_41 = 0;
  local_110 = (pointer)0x0;
  if (this != (spvc_compiler_s *)0x0) {
    local_41 = 1;
    spvc_compiler_s::spvc_compiler_s(this);
    local_110 = this;
  }
  std::unique_ptr<spvc_compiler_s,std::default_delete<spvc_compiler_s>>::
  unique_ptr<std::default_delete<spvc_compiler_s>,void>
            ((unique_ptr<spvc_compiler_s,std::default_delete<spvc_compiler_s>> *)&local_40,local_110
            );
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_40);
  if (bVar1) {
    psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::operator->
                       (&local_40);
    psVar2->backend = backend;
    psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::operator->
                       (&local_40);
    psVar2->context = context;
    if ((mode == SPVC_CAPTURE_MODE_COPY) || (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)) {
      switch(backend) {
      case SPVC_BACKEND_NONE:
        if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar3 = (Compiler *)operator_new(0xc68);
          spirv_cross::Compiler::Compiler(pCVar3,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,pCVar3);
        }
        else if (mode == SPVC_CAPTURE_MODE_COPY) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar3 = (Compiler *)operator_new(0xc68);
          spirv_cross::Compiler::Compiler(pCVar3,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,pCVar3);
        }
        break;
      case SPVC_BACKEND_GLSL:
        if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar4 = (CompilerGLSL *)operator_new(0x2678);
          spirv_cross::CompilerGLSL::CompilerGLSL(pCVar4,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar4);
        }
        else if (mode == SPVC_CAPTURE_MODE_COPY) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar4 = (CompilerGLSL *)operator_new(0x2678);
          spirv_cross::CompilerGLSL::CompilerGLSL(pCVar4,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar4);
        }
        break;
      case SPVC_BACKEND_HLSL:
        if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar5 = (CompilerHLSL *)operator_new(0x2920);
          spirv_cross::CompilerHLSL::CompilerHLSL(pCVar5,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar5);
        }
        else if (mode == SPVC_CAPTURE_MODE_COPY) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar5 = (CompilerHLSL *)operator_new(0x2920);
          spirv_cross::CompilerHLSL::CompilerHLSL(pCVar5,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar5);
        }
        break;
      case SPVC_BACKEND_MSL:
        if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar6 = (CompilerMSL *)operator_new(0x30b0);
          spirv_cross::CompilerMSL::CompilerMSL(pCVar6,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar6);
        }
        else if (mode == SPVC_CAPTURE_MODE_COPY) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar6 = (CompilerMSL *)operator_new(0x30b0);
          spirv_cross::CompilerMSL::CompilerMSL(pCVar6,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar6);
        }
        break;
      case SPVC_BACKEND_CPP:
        if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar7 = (CompilerCPP *)operator_new(0x27f8);
          spirv_cross::CompilerCPP::CompilerCPP(pCVar7,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar7);
        }
        else if (mode == SPVC_CAPTURE_MODE_COPY) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar7 = (CompilerCPP *)operator_new(0x27f8);
          spirv_cross::CompilerCPP::CompilerCPP(pCVar7,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar7);
        }
        break;
      case SPVC_BACKEND_JSON:
        if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar8 = (CompilerReflection *)operator_new(0x2688);
          spirv_cross::CompilerReflection::CompilerReflection(pCVar8,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar8);
        }
        else if (mode == SPVC_CAPTURE_MODE_COPY) {
          psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::
                   operator->(&local_40);
          pCVar8 = (CompilerReflection *)operator_new(0x2688);
          spirv_cross::CompilerReflection::CompilerReflection(pCVar8,&parsed_ir->parsed);
          std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::reset
                    (&psVar2->compiler,(pointer)pCVar8);
        }
        break;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c8,"Invalid backend.",&local_c9);
        spvc_context_s::report_error(context,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        context_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
        local_80 = 1;
        goto LAB_001ae093;
      }
      psVar2 = std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::get
                         (&local_40);
      *(pointer *)
       comp._M_t.super___uniq_ptr_impl<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>._M_t.
       super__Tuple_impl<0UL,_spvc_compiler_s_*,_std::default_delete<spvc_compiler_s>_>.
       super__Head_base<0UL,_spvc_compiler_s_*,_false>._M_head_impl = psVar2;
      std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
      unique_ptr<spvc_compiler_s,std::default_delete<spvc_compiler_s>,void>
                ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *
                 )&e,&local_40);
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::push_back(&context->allocations,
                  (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)&e);
      std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
      ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)&e);
      local_80 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a0,"Invalid argument for capture mode.",&local_a1);
      spvc_context_s::report_error(context,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      context_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
      local_80 = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"Out of memory.",&local_69);
    spvc_context_s::report_error(context,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    context_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
    local_80 = 1;
  }
LAB_001ae093:
  std::unique_ptr<spvc_compiler_s,_std::default_delete<spvc_compiler_s>_>::~unique_ptr(&local_40);
  if (local_80 == 0) {
    context_local._4_4_ = SPVC_SUCCESS;
  }
  return context_local._4_4_;
}

Assistant:

spvc_result spvc_context_create_compiler(spvc_context context, spvc_backend backend, spvc_parsed_ir parsed_ir,
                                         spvc_capture_mode mode, spvc_compiler *compiler)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_compiler_s> comp(new (std::nothrow) spvc_compiler_s);
		if (!comp)
		{
			context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}
		comp->backend = backend;
		comp->context = context;

		if (mode != SPVC_CAPTURE_MODE_COPY && mode != SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
		{
			context->report_error("Invalid argument for capture mode.");
			return SPVC_ERROR_INVALID_ARGUMENT;
		}

		switch (backend)
		{
		case SPVC_BACKEND_NONE:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new Compiler(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new Compiler(parsed_ir->parsed));
			break;

#if SPIRV_CROSS_C_API_GLSL
		case SPVC_BACKEND_GLSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerGLSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerGLSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_HLSL
		case SPVC_BACKEND_HLSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerHLSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerHLSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_MSL
		case SPVC_BACKEND_MSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerMSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerMSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_CPP
		case SPVC_BACKEND_CPP:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerCPP(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerCPP(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_REFLECT
		case SPVC_BACKEND_JSON:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerReflection(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerReflection(parsed_ir->parsed));
			break;
#endif

		default:
			context->report_error("Invalid backend.");
			return SPVC_ERROR_INVALID_ARGUMENT;
		}

		*compiler = comp.get();
		context->allocations.push_back(std::move(comp));
	}